

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O0

econf_err getIntValueNum(econf_file key_file,size_t num,int32_t *result)

{
  int *piVar1;
  long lVar2;
  char *local_28;
  char *endptr;
  int32_t *result_local;
  size_t num_local;
  
  endptr = (char *)result;
  result_local = (int32_t *)num;
  piVar1 = __errno_location();
  *piVar1 = 0;
  lVar2 = strtol(key_file.file_entry[(long)result_local].value,&local_28,0);
  *(int *)endptr = (int)lVar2;
  if (((local_28 != key_file.file_entry[(long)result_local].value) &&
      (piVar1 = __errno_location(), *piVar1 != 0x22)) &&
     ((piVar1 = __errno_location(), *piVar1 == 0 || (*(int *)endptr != 0)))) {
    return ECONF_SUCCESS;
  }
  return ECONF_VALUE_CONVERSION_ERROR;
}

Assistant:

econf_err getIntValueNum(econf_file key_file, size_t num, int32_t *result) {
  char *endptr;
  errno = 0;
  *result = strtol(key_file.file_entry[num].value, &endptr, 0);
  if (endptr == key_file.file_entry[num].value || errno == ERANGE || (errno != 0 && *result == 0))
    return ECONF_VALUE_CONVERSION_ERROR;
  return ECONF_SUCCESS;
}